

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

MmapRange kj::anon_unknown_9::getMmapRange(uint64_t offset,uint64_t size)

{
  int iVar1;
  MmapRange MVar2;
  
  if ((anonymous_namespace)::getMmapRange(unsigned_long,unsigned_long)::pageSize == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::getMmapRange(unsigned_long,unsigned_long)::
                                 pageSize);
    if (iVar1 != 0) {
      getMmapRange::pageSize = sysconf(0x1e);
      __cxa_guard_release(&(anonymous_namespace)::getMmapRange(unsigned_long,unsigned_long)::
                           pageSize);
    }
  }
  MVar2.offset = -getMmapRange::pageSize & offset;
  MVar2.size = (size + offset) - MVar2.offset;
  return MVar2;
}

Assistant:

static MmapRange getMmapRange(uint64_t offset, uint64_t size) {
  // Comes up with an offset and size to pass to mmap(), given an offset and size requested by
  // the caller, and considering the fact that mappings must start at a page boundary.
  //
  // The offset is rounded down to the nearest page boundary, and the size is increased to
  // compensate. Note that the endpoint of the mapping is *not* rounded up to a page boundary, as
  // mmap() does not actually require this, and it causes trouble on some systems (notably Cygwin).

#ifndef _SC_PAGESIZE
#define _SC_PAGESIZE _SC_PAGE_SIZE
#endif
  static const uint64_t pageSize = sysconf(_SC_PAGESIZE);
  uint64_t pageMask = pageSize - 1;

  uint64_t realOffset = offset & ~pageMask;

  return { realOffset, offset + size - realOffset };
}